

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_280db::ArenaTest_ArenaWithAllocCleanup_Test::
~ArenaTest_ArenaWithAllocCleanup_Test(ArenaTest_ArenaWithAllocCleanup_Test *this)

{
  ArenaTest_ArenaWithAllocCleanup_Test *this_local;
  
  ~ArenaTest_ArenaWithAllocCleanup_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, ArenaWithAllocCleanup) {
  CustomAlloc alloc = {{&CustomAllocFunc}, 0, false};
  upb_Arena* arena =
      upb_Arena_Init(nullptr, 0, reinterpret_cast<upb_alloc*>(&alloc));
  EXPECT_EQ(alloc.counter, 1);
  upb_Arena_SetAllocCleanup(arena, CustomAllocCleanup);
  upb_Arena_Free(arena);
  EXPECT_TRUE(alloc.ran_cleanup);
}